

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_mol_edge_state.cpp
# Opt level: O0

void MOL::ComputeEdgeState
               (Box *bx,Array4<double> *xedge,Array4<double> *yedge,Array4<double> *zedge,
               Array4<const_double> *q,int ncomp,Array4<const_double> *umac,
               Array4<const_double> *vmac,Array4<const_double> *wmac,Box *domain,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               bool is_velocity)

{
  int iVar1;
  int iVar2;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  int *in_RDI;
  void *in_R8;
  undefined4 in_R9D;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  Box *in_stack_00000020;
  byte in_stack_00000038;
  bool has_extdir_or_ho_hi;
  bool has_extdir_or_ho_lo;
  pair<bool,_bool> extdir_lohi;
  Box bx_3;
  Box *wbx;
  Box bx_2;
  Box *vbx;
  Box bx_1;
  Box *ubx;
  int domain_khi;
  int domain_klo;
  int domain_jhi;
  int domain_jlo;
  int domain_ihi;
  int domain_ilo;
  undefined8 in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff874;
  int in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a4;
  undefined8 in_stack_fffffffffffff8a8;
  Box *pBVar3;
  int ncomp_00;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  undefined1 auStack_710 [64];
  int local_6d0;
  int local_6cc;
  undefined1 auStack_6c8 [64];
  undefined1 auStack_688 [64];
  byte local_648;
  undefined1 auStack_638 [64];
  int local_5f8;
  int local_5f4;
  undefined1 auStack_5f0 [64];
  undefined1 auStack_5b0 [64];
  byte local_570;
  pair<bool,_bool> local_562 [5];
  undefined1 auStack_558 [64];
  int local_518;
  int local_514;
  undefined1 auStack_510 [64];
  undefined1 auStack_4d0 [64];
  byte local_490;
  undefined1 auStack_480 [64];
  int local_440;
  int local_43c;
  undefined1 auStack_438 [64];
  undefined1 auStack_3f8 [64];
  byte local_3b8;
  pair<bool,_bool> local_3aa [5];
  undefined1 auStack_3a0 [64];
  int local_360;
  int local_35c;
  undefined1 auStack_358 [64];
  undefined1 auStack_318 [64];
  byte local_2d8;
  undefined1 auStack_2c8 [64];
  int local_288;
  int local_284;
  undefined1 auStack_280 [64];
  undefined1 auStack_240 [64];
  byte local_200;
  byte local_1f8;
  byte local_1f7;
  pair<bool,_bool> local_1f6;
  Box local_1f4;
  Box *local_1d8;
  Box local_1cc;
  Box *local_1b0;
  Box local_1a4;
  Box *local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  byte local_165;
  undefined4 local_164;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  int *local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  int *local_120;
  undefined4 local_114;
  int *local_110;
  undefined4 local_104;
  Box *local_100;
  undefined4 local_f4;
  Box *local_f0;
  undefined4 local_e4;
  Box *local_e0;
  undefined4 local_d4;
  IndexType *local_d0;
  undefined4 local_c4;
  IndexType *local_c0;
  undefined4 local_b4;
  IndexType *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  IntVect *local_a0;
  undefined4 local_98;
  undefined4 local_94;
  IntVect *local_90;
  undefined4 local_88;
  undefined4 local_84;
  IntVect *local_80;
  undefined4 local_74;
  IndexType *local_70;
  undefined4 local_64;
  IndexType *local_60;
  undefined4 local_54;
  IndexType *local_50;
  undefined4 local_44;
  IndexType *local_40;
  undefined4 local_34;
  IndexType *local_30;
  undefined4 local_24;
  IndexType *local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  ncomp_00 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
  local_165 = in_stack_00000038 & 1;
  local_164 = in_R9D;
  local_160 = in_R8;
  local_158 = in_RCX;
  local_150 = in_RDX;
  local_148 = in_RSI;
  local_140 = in_RDI;
  local_16c = amrex::Box::smallEnd(in_stack_00000020,0);
  local_170 = amrex::Box::bigEnd(in_stack_00000020,0);
  local_174 = amrex::Box::smallEnd(in_stack_00000020,1);
  local_178 = amrex::Box::bigEnd(in_stack_00000020,1);
  local_17c = amrex::Box::smallEnd(in_stack_00000020,2);
  local_180 = amrex::Box::bigEnd(in_stack_00000020,2);
  local_110 = local_140;
  local_114 = 0;
  local_1a4.smallend.vect._0_8_ = *(undefined8 *)local_140;
  local_1a4.smallend.vect[2] = local_140[2];
  local_1a4.bigend.vect[0] = local_140[3];
  local_1a4.bigend.vect._4_8_ = *(undefined8 *)(local_140 + 4);
  local_1a4.btype.itype = local_140[6];
  local_100 = &local_1a4;
  local_104 = 0;
  local_b0 = &local_1a4.btype;
  local_b4 = 0;
  local_44 = 0;
  local_10 = 0;
  if ((local_1a4.btype.itype & 1) == 0) {
    local_80 = &local_1a4.bigend;
    local_84 = 0;
    local_88 = 1;
    local_50 = &local_1a4.btype;
    local_54 = 0;
    local_c = 0;
    local_1a4.btype.itype = local_1a4.btype.itype | 1;
  }
  local_188 = &local_1a4;
  local_120 = local_140;
  local_124 = 1;
  local_1cc.smallend.vect._0_8_ = *(undefined8 *)local_140;
  local_1cc.smallend.vect[2] = local_140[2];
  local_1cc.bigend.vect[0] = local_140[3];
  local_1cc.bigend.vect._4_8_ = *(undefined8 *)(local_140 + 4);
  local_1cc.btype.itype = local_140[6];
  local_f0 = &local_1cc;
  local_f4 = 1;
  local_c0 = &local_1cc.btype;
  local_c4 = 1;
  local_34 = 1;
  local_14 = 1;
  if ((local_1cc.btype.itype & 2) == 0) {
    local_90 = &local_1cc.bigend;
    local_94 = 1;
    local_98 = 1;
    local_60 = &local_1cc.btype;
    local_64 = 1;
    local_8 = 1;
    local_1cc.btype.itype = local_1cc.btype.itype | 2;
  }
  local_1b0 = &local_1cc;
  local_130 = local_140;
  local_134 = 2;
  local_1f4.smallend.vect._0_8_ = *(undefined8 *)local_140;
  local_1f4.smallend.vect[2] = local_140[2];
  local_1f4.bigend.vect[0] = local_140[3];
  local_1f4.bigend.vect._4_8_ = *(undefined8 *)(local_140 + 4);
  local_1f4.btype.itype = local_140[6];
  local_e0 = &local_1f4;
  local_e4 = 2;
  local_d0 = &local_1f4.btype;
  local_d4 = 2;
  local_24 = 2;
  local_18 = 2;
  if ((local_1f4.btype.itype & 4) == 0) {
    local_a0 = &local_1f4.bigend;
    local_a4 = 2;
    local_a8 = 1;
    local_70 = &local_1f4.btype;
    local_74 = 2;
    local_4 = 2;
    local_1f4.btype.itype = local_1f4.btype.itype | 4;
  }
  local_1d8 = &local_1f4;
  local_40 = local_b0;
  local_30 = local_c0;
  local_20 = local_d0;
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x6a213d);
  local_1f6 = anon_unknown.dwarf_4afaf8::has_extdir_or_ho
                        ((BCRec *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                         (int)((ulong)in_stack_fffffffffffff868 >> 0x20),
                         (int)in_stack_fffffffffffff868);
  iVar2 = local_16c;
  local_1f7 = local_1f6.first & 1;
  local_1f8 = local_1f6.second & 1;
  if (((ushort)local_1f6 & 1) == 0) {
LAB_006a21a7:
    iVar2 = local_170;
    if ((local_1f8 & 1) != 0) {
      iVar1 = amrex::Box::bigEnd(local_188,0);
      if (iVar2 <= iVar1) goto LAB_006a21dd;
    }
    pBVar3 = local_188;
    memcpy(auStack_3a0,local_160,0x3c);
    ncomp_00 = (int)((ulong)pBVar3 >> 0x20);
    local_360 = local_16c;
    local_35c = local_170;
    memcpy(auStack_358,in_stack_00000008,0x3c);
    memcpy(auStack_318,local_148,0x3c);
    local_2d8 = local_165 & 1;
    amrex::
    ParallelFor<int,MOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__1,void>
              ((Box *)CONCAT44(local_164,in_stack_fffffffffffff8b0),ncomp_00,
               (anon_class_216_7_1edfe0a6 *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    in_stack_fffffffffffff8b4 = local_164;
  }
  else {
    iVar1 = amrex::Box::smallEnd(local_188,0);
    if (iVar2 < iVar1 + -1) goto LAB_006a21a7;
LAB_006a21dd:
    memcpy(auStack_2c8,local_160,0x3c);
    local_288 = local_16c;
    local_284 = local_170;
    memcpy(auStack_280,in_stack_00000008,0x3c);
    memcpy(auStack_240,local_148,0x3c);
    local_200 = local_165 & 1;
    amrex::
    ParallelFor<int,MOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__0,void>
              ((Box *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),ncomp_00,
               (anon_class_216_7_1edfe0a6 *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  }
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x6a237d);
  local_3aa[0] = anon_unknown.dwarf_4afaf8::has_extdir_or_ho
                           ((BCRec *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                            (int)((ulong)in_stack_fffffffffffff868 >> 0x20),
                            (int)in_stack_fffffffffffff868);
  std::pair<bool,_bool>::operator=(&local_1f6,local_3aa);
  local_1f7 = local_1f6.first & 1;
  local_1f8 = local_1f6.second & 1;
  if (((ushort)local_1f6 & 1) == 0) {
LAB_006a2402:
    if ((local_1f8 & 1) != 0) {
      in_stack_fffffffffffff8a0 = local_178;
      iVar2 = amrex::Box::bigEnd(local_1b0,1);
      if (in_stack_fffffffffffff8a0 <= iVar2) goto LAB_006a243b;
    }
    memcpy(auStack_558,local_160,0x3c);
    local_518 = local_174;
    local_514 = local_178;
    memcpy(auStack_510,in_stack_00000010,0x3c);
    memcpy(auStack_4d0,local_150,0x3c);
    local_490 = local_165 & 1;
    amrex::
    ParallelFor<int,MOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__3,void>
              ((Box *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),ncomp_00,
               (anon_class_216_7_58e4a5c4 *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  }
  else {
    in_stack_fffffffffffff8a4 = local_174;
    iVar2 = amrex::Box::smallEnd(local_1b0,1);
    if (in_stack_fffffffffffff8a4 < iVar2 + -1) goto LAB_006a2402;
LAB_006a243b:
    memcpy(auStack_480,local_160,0x3c);
    local_440 = local_174;
    local_43c = local_178;
    memcpy(auStack_438,in_stack_00000010,0x3c);
    memcpy(auStack_3f8,local_150,0x3c);
    local_3b8 = local_165 & 1;
    amrex::
    ParallelFor<int,MOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__2,void>
              ((Box *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),ncomp_00,
               (anon_class_216_7_58e4a5c4 *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  }
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x6a25db);
  local_562[0] = anon_unknown.dwarf_4afaf8::has_extdir_or_ho
                           ((BCRec *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                            (int)((ulong)in_stack_fffffffffffff868 >> 0x20),
                            (int)in_stack_fffffffffffff868);
  std::pair<bool,_bool>::operator=(&local_1f6,local_562);
  iVar2 = local_17c;
  local_1f7 = local_1f6.first & 1;
  local_1f8 = local_1f6.second & 1;
  if (((ushort)local_1f6 & 1) == 0) {
LAB_006a2660:
    iVar2 = local_180;
    if ((local_1f8 & 1) != 0) {
      iVar1 = amrex::Box::bigEnd(local_1d8,2);
      if (iVar2 <= iVar1) goto LAB_006a2699;
    }
    memcpy(auStack_710,local_160,0x3c);
    local_6d0 = local_17c;
    local_6cc = local_180;
    memcpy(auStack_6c8,in_stack_00000018,0x3c);
    memcpy(auStack_688,local_158,0x3c);
    local_648 = local_165 & 1;
    amrex::
    ParallelFor<int,MOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__5,void>
              ((Box *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),ncomp_00,
               (anon_class_216_7_92e96ae2 *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  }
  else {
    iVar1 = amrex::Box::smallEnd(local_1d8,2);
    if (iVar2 < iVar1 + -1) goto LAB_006a2660;
LAB_006a2699:
    memcpy(auStack_638,local_160,0x3c);
    local_5f8 = local_17c;
    local_5f4 = local_180;
    memcpy(auStack_5f0,in_stack_00000018,0x3c);
    memcpy(auStack_5b0,local_158,0x3c);
    local_570 = local_165 & 1;
    amrex::
    ParallelFor<int,MOL::ComputeEdgeState(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,int,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Box_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__4,void>
              ((Box *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),ncomp_00,
               (anon_class_216_7_92e96ae2 *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  }
  return;
}

Assistant:

void
MOL::ComputeEdgeState (const Box& bx,
                       AMREX_D_DECL( Array4<Real> const& xedge,
                                     Array4<Real> const& yedge,
                                     Array4<Real> const& zedge),
                       Array4<Real const> const& q,
                       const int ncomp,
                       AMREX_D_DECL( Array4<Real const> const& umac,
                                     Array4<Real const> const& vmac,
                                     Array4<Real const> const& wmac),
                       const Box&       domain,
                       const Vector<BCRec>& bcs,
                       const        BCRec * d_bcrec_ptr,
                       bool         is_velocity)
{
    const int domain_ilo = domain.smallEnd(0);
    const int domain_ihi = domain.bigEnd(0);
    const int domain_jlo = domain.smallEnd(1);
    const int domain_jhi = domain.bigEnd(1);
#if (AMREX_SPACEDIM==3)
    const int domain_klo = domain.smallEnd(2);
    const int domain_khi = domain.bigEnd(2);
#endif

    AMREX_D_TERM( const Box& ubx = amrex::surroundingNodes(bx,0);,
                  const Box& vbx = amrex::surroundingNodes(bx,1);,
                  const Box& wbx = amrex::surroundingNodes(bx,2););

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 0);
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi && domain_ihi <= ubx.bigEnd(0)))
    {
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,domain_ilo,domain_ihi,umac,xedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            xedge(i,j,k,n) = MOL::hydro_mol_xedge_state_extdir( i, j, k, n, q, umac,
                                                                d_bcrec_ptr,
                                                                domain_ilo, domain_ihi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,domain_ilo,domain_ihi,umac,xedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            xedge(i,j,k,n) = MOL::hydro_mol_xedge_state( i, j, k, n, q, umac,
                                                         d_bcrec_ptr,
                                                         domain_ilo, domain_ihi,
                                                         is_velocity);
        });
    }

    extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 1);
    has_extdir_or_ho_lo = extdir_lohi.first;
    has_extdir_or_ho_hi = extdir_lohi.second;
    if ((has_extdir_or_ho_lo && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi && domain_jhi <= vbx.bigEnd(1)))
    {
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,domain_jlo,domain_jhi,vmac,yedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            yedge(i,j,k,n) = MOL::hydro_mol_yedge_state_extdir( i, j, k, n, q, vmac,
                                                                d_bcrec_ptr,
                                                                domain_jlo, domain_jhi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,domain_jlo,domain_jhi,vmac,yedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            yedge(i,j,k,n) = MOL::hydro_mol_yedge_state( i, j, k, n, q, vmac,
                                                         d_bcrec_ptr,
                                                         domain_jlo, domain_jhi,
                                                         is_velocity);
        });
    }


#if ( AMREX_SPACEDIM ==3 )

    extdir_lohi = has_extdir_or_ho(bcs.dataPtr(), ncomp, 2);
    has_extdir_or_ho_lo = extdir_lohi.first;
    has_extdir_or_ho_hi = extdir_lohi.second;
    if ((has_extdir_or_ho_lo && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi && domain_khi <= wbx.bigEnd(2)))
    {
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,domain_klo,domain_khi,wmac,zedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            zedge(i,j,k,n) = MOL::hydro_mol_zedge_state_extdir( i, j, k, n, q, wmac,
                                                                d_bcrec_ptr,
                                                                domain_klo, domain_khi,
                                                                is_velocity);
        });
    }
    else
    {
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,domain_klo,domain_khi,wmac,zedge,is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            zedge(i,j,k,n) = MOL::hydro_mol_zedge_state( i, j, k, n, q, wmac,
                                                         d_bcrec_ptr,
                                                         domain_klo, domain_khi,
                                                         is_velocity);
        });
    }

#endif
}